

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O2

RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,2,2,0,2,2>>::
computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,2,2,0,2,2>>,Eigen::HouseholderSequence<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,1,1,0,1,1>,1>>
          (RealSchur<Eigen::Matrix<double,2,2,0,2,2>> *this,
          HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *matrixH,
          HouseholderSequence<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>
          *matrixQ,bool computeU)

{
  bool bVar1;
  Index IVar2;
  Index il;
  undefined7 in_register_00000009;
  long iter;
  int iVar3;
  long lVar4;
  long iu;
  Scalar SVar5;
  long local_98;
  Scalar exshift;
  int local_84;
  RealSchur<Eigen::Matrix<double,2,2,0,2,2>> *local_80;
  RealSchur<Eigen::Matrix<double,2,2,0,2,2>> *local_78;
  Index im;
  Vector3s local_68;
  Vector3s shiftInfo;
  
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>> *)this,
             (ReturnByValue<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)matrixH);
  iVar3 = (int)CONCAT71(in_register_00000009,computeU);
  if (iVar3 != 0) {
    HouseholderSequence<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,1,1,0,1,1>,1>::
    evalTo<Eigen::Matrix<double,2,2,0,2,2>>
              ((HouseholderSequence<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,1,1,0,1,1>,1>
                *)matrixQ,(Matrix<double,_2,_2,_0,_2,_2> *)(this + 0x20));
  }
  local_98 = *(long *)(this + 0xa8);
  if (local_98 == -1) {
    IVar2 = internal::
            HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::rows
                      (matrixH);
    local_98 = IVar2 * 0x28;
  }
  exshift = 0.0;
  SVar5 = RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::computeNormOfT
                    ((RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this);
  local_84 = iVar3;
  if ((SVar5 != 0.0) || (NAN(SVar5))) {
    local_80 = this + 0x40;
    local_78 = this + -0x10;
    iu = 1;
    iter = 0;
    lVar4 = 0;
    do {
      il = RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::findSmallSubdiagEntry
                     ((RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,iu);
      if (il == iu) {
        *(double *)(this + iu * 0x18) = *(double *)(this + iu * 0x18) + exshift;
        if (0 < iu) {
          *(undefined8 *)(local_78 + iu * 0x18) = 0;
        }
        iu = iu + -1;
LAB_0015e2f9:
        bVar1 = true;
        iter = 0;
      }
      else {
        if (il == iu + -1) {
          RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::splitOffTwoRows
                    ((RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,iu,computeU,&exshift);
          iu = iu + -2;
          goto LAB_0015e2f9;
        }
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = 0.0;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = 0.0;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = 0.0;
        RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::computeShift
                  ((RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,iu,iter,&exshift,
                   &shiftInfo);
        bVar1 = lVar4 < local_98;
        if (lVar4 < local_98) {
          RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::initFrancisQRStep
                    ((RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,il,iu,&shiftInfo,&im,
                     &local_68);
          RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::performFrancisQRStep
                    ((RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,il,im,iu,computeU,
                     &local_68,(Scalar *)local_80);
        }
        iter = iter + 1;
        lVar4 = lVar4 + 1;
      }
    } while ((bVar1) && (-1 < iu));
  }
  else {
    lVar4 = 0;
  }
  *(uint *)(this + 0xa0) = (uint)(local_98 < lVar4) * 2;
  this[0xa4] = (RealSchur<Eigen::Matrix<double,2,2,0,2,2>>)0x1;
  this[0xa5] = SUB41(local_84,0);
  return (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this;
}

Assistant:

RealSchur<MatrixType>& RealSchur<MatrixType>::computeFromHessenberg(const HessMatrixType& matrixH, const OrthMatrixType& matrixQ,  bool computeU)
{  
  m_matT = matrixH; 
  if(computeU)
    m_matU = matrixQ;
  
  Index maxIters = m_maxIters;
  if (maxIters == -1)
    maxIters = m_maxIterationsPerRow * matrixH.rows();
  m_workspaceVector.resize(m_matT.cols());
  Scalar* workspace = &m_workspaceVector.coeffRef(0);

  // The matrix m_matT is divided in three parts. 
  // Rows 0,...,il-1 are decoupled from the rest because m_matT(il,il-1) is zero. 
  // Rows il,...,iu is the part we are working on (the active window).
  // Rows iu+1,...,end are already brought in triangular form.
  Index iu = m_matT.cols() - 1;
  Index iter = 0;      // iteration count for current eigenvalue
  Index totalIter = 0; // iteration count for whole matrix
  Scalar exshift(0);   // sum of exceptional shifts
  Scalar norm = computeNormOfT();

  if(norm!=0)
  {
    while (iu >= 0)
    {
      Index il = findSmallSubdiagEntry(iu);

      // Check for convergence
      if (il == iu) // One root found
      {
        m_matT.coeffRef(iu,iu) = m_matT.coeff(iu,iu) + exshift;
        if (iu > 0)
          m_matT.coeffRef(iu, iu-1) = Scalar(0);
        iu--;
        iter = 0;
      }
      else if (il == iu-1) // Two roots found
      {
        splitOffTwoRows(iu, computeU, exshift);
        iu -= 2;
        iter = 0;
      }
      else // No convergence yet
      {
        // The firstHouseholderVector vector has to be initialized to something to get rid of a silly GCC warning (-O1 -Wall -DNDEBUG )
        Vector3s firstHouseholderVector(0,0,0), shiftInfo;
        computeShift(iu, iter, exshift, shiftInfo);
        iter = iter + 1;
        totalIter = totalIter + 1;
        if (totalIter > maxIters) break;
        Index im;
        initFrancisQRStep(il, iu, shiftInfo, im, firstHouseholderVector);
        performFrancisQRStep(il, im, iu, computeU, firstHouseholderVector, workspace);
      }
    }
  }
  if(totalIter <= maxIters)
    m_info = Success;
  else
    m_info = NoConvergence;

  m_isInitialized = true;
  m_matUisUptodate = computeU;
  return *this;
}